

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SliceLayerParams::SerializeWithCachedSizes
          (SliceLayerParams *this,CodedOutputStream *output)

{
  if (this->startindex_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->startindex_,output);
  }
  if (this->endindex_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->endindex_,output);
  }
  if (this->stride_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(3,this->stride_,output);
  }
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(4,this->axis_,output);
    return;
  }
  return;
}

Assistant:

void SliceLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 startIndex = 1;
  if (this->startindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->startindex(), output);
  }

  // int64 endIndex = 2;
  if (this->endindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->endindex(), output);
  }

  // uint64 stride = 3;
  if (this->stride() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(3, this->stride(), output);
  }

  // .CoreML.Specification.SliceLayerParams.SliceAxis axis = 4;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      4, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceLayerParams)
}